

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

void __thiscall QDialogButtonBox::~QDialogButtonBox(QDialogButtonBox *this)

{
  ~QDialogButtonBox(this + -0x10);
  operator_delete(this + -0x10,0x28);
  return;
}

Assistant:

QDialogButtonBox::~QDialogButtonBox()
{
    Q_D(QDialogButtonBox);

    d->ignoreShowAndHide = true;

    // QObjectPrivate::connect requires explicit disconnect in destructor
    // otherwise the connection may kick in on child destruction and reach
    // the parent's destroyed private object
    d->disconnectAll();
    // ditto event filter:
    d->filter.reset();
}